

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

void time_main<trng::mrg3s>(mrg3s *r,string *name)

{
  result_type rVar1;
  ulong uVar2;
  string *in_RSI;
  double dVar3;
  double res_canonical;
  double res_oo;
  double res_oc;
  double res_co;
  double res_cc;
  result_type res_plain;
  stringstream s;
  mrg3s *in_stack_fffffffffffffe60;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (0x1f < uVar2) break;
    std::__cxx11::string::operator+=(in_RSI,' ');
  }
  std::operator<<((ostream *)&std::cout,in_RSI);
  rVar1 = time_plain<trng::mrg3s>(in_stack_fffffffffffffe60);
  std::ostream::operator<<(local_188,rVar1);
  dVar3 = time_cc<trng::mrg3s>(in_stack_fffffffffffffe60);
  std::ostream::operator<<(local_188,dVar3);
  dVar3 = time_co<trng::mrg3s>(in_stack_fffffffffffffe60);
  std::ostream::operator<<(local_188,dVar3);
  dVar3 = time_oc<trng::mrg3s>(in_stack_fffffffffffffe60);
  std::ostream::operator<<(local_188,dVar3);
  dVar3 = time_oo<trng::mrg3s>(in_stack_fffffffffffffe60);
  std::ostream::operator<<(local_188,dVar3);
  dVar3 = time_canonical<trng::mrg3s,double>(in_stack_fffffffffffffe60);
  std::ostream::operator<<(local_188,dVar3);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void time_main(R &r, std::string name) {
  std::stringstream s;  // write data to stream to prevent that code gets optimized away
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  const auto res_plain = time_plain(r);
  s << res_plain;
  const auto res_cc = time_cc(r);
  s << res_cc;
  const auto res_co = time_co(r);
  s << res_co;
  const auto res_oc = time_oc(r);
  s << res_oc;
  const auto res_oo = time_oo(r);
  s << res_oo;
  const auto res_canonical = time_canonical<R, double>(r);
  s << res_canonical;
  std::cout << std::endl;
}